

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall rpn::RPNExpression::Push<rpn::FunctionRefExpression>(RPNExpression *this)

{
  unique_ptr<rpn::FunctionRefExpression,_std::default_delete<rpn::FunctionRefExpression>_> local_20;
  unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> local_18;
  RPNExpression *local_10;
  RPNExpression *this_local;
  
  local_10 = this;
  std::make_unique<rpn::FunctionRefExpression>();
  std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>::
  unique_ptr<rpn::FunctionRefExpression,std::default_delete<rpn::FunctionRefExpression>,void>
            ((unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>> *)&local_18,
             &local_20);
  Push(this,(expression_ptr *)&local_18);
  std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>::~unique_ptr(&local_18);
  std::unique_ptr<rpn::FunctionRefExpression,_std::default_delete<rpn::FunctionRefExpression>_>::
  ~unique_ptr(&local_20);
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }